

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O2

void msd_CE6(uchar **strings,size_t n,size_t depth,uint16_t *oracle,uchar **sorted)

{
  uchar *puVar1;
  size_t sVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  size_t i_1;
  long *__ptr;
  size_t sVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  
  if (0xffff < n) {
    for (uVar7 = 0; uVar7 < (n & 0xfffffffffffffffe); uVar7 = uVar7 + 2) {
      puVar1 = strings[uVar7 + 1];
      uVar3 = get_char<unsigned_short>(strings[uVar7],depth);
      uVar4 = get_char<unsigned_short>(puVar1,depth);
      oracle[uVar7] = uVar3;
      oracle[uVar7 + 1] = uVar4;
    }
    for (; uVar7 < n; uVar7 = uVar7 + 1) {
      uVar3 = get_char<unsigned_short>(strings[uVar7],depth);
      oracle[uVar7] = uVar3;
    }
    __ptr = (long *)calloc(0x10000,8);
    for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
      __ptr[oracle[sVar5]] = __ptr[oracle[sVar5]] + 1;
    }
    msd_CE6::bucketindex[0] = 0;
    sVar5 = 0;
    for (lVar6 = 0; lVar6 != 0xffff; lVar6 = lVar6 + 1) {
      sVar5 = sVar5 + __ptr[lVar6];
      msd_CE6::bucketindex[lVar6 + 1] = sVar5;
    }
    for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
      puVar1 = strings[sVar5];
      sVar2 = msd_CE6::bucketindex[oracle[sVar5]];
      msd_CE6::bucketindex[oracle[sVar5]] = sVar2 + 1;
      sorted[sVar2] = puVar1;
    }
    memcpy(strings,sorted,n << 3);
    lVar6 = *__ptr;
    for (lVar8 = 1; lVar8 != 0x10000; lVar8 = lVar8 + 1) {
      sVar5 = __ptr[lVar8];
      if (sVar5 != 0) {
        if ((char)lVar8 != '\0') {
          msd_CE6(strings + lVar6,sVar5,depth + 2,oracle,sorted);
        }
        lVar6 = lVar6 + sVar5;
      }
    }
    free(__ptr);
    return;
  }
  msd_CE2_16bit_5(strings,n,depth,(uchar *)oracle,sorted);
  return;
}

Assistant:

static void
msd_CE6(unsigned char** strings, size_t n, size_t depth,
		uint16_t* oracle, unsigned char** sorted)
{
	if (n < 0x10000) {
		msd_CE2_16bit_5(strings, n, depth, (unsigned char*)oracle, sorted);
		return;
	}
	{
		size_t i;
		for (i=0; i < n-n%2; i+=2) {
			unsigned char* str1 = strings[i];
			unsigned char* str2 = strings[i+1];
			uint16_t ch1 = get_char<uint16_t>(str1, depth);
			uint16_t ch2 = get_char<uint16_t>(str2, depth);
			oracle[i] = ch1;
			oracle[i+1] = ch2;
		}
		for (; i < n; ++i)
			oracle[i] = get_char<uint16_t>(strings[i], depth);
	}
	size_t* restrict bucketsize = (size_t*)
		calloc(0x10000, sizeof(size_t));
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	static size_t bucketindex[0x10000];
	bucketindex[0] = 0;
	for (size_t i=1; i < 0x10000; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_CE6(strings+bsum, bucketsize[i],
				depth+2, oracle, sorted);
		bsum += bucketsize[i];
	}
	free(bucketsize);
}